

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void clear_advisor_read_lock(char *filename)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  uint __errnum;
  bool bVar4;
  
  iVar1 = unlink(filename);
  bVar4 = iVar1 == 0;
  if (bVar4) {
    __errnum = 0;
  }
  else {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    while (__errnum == 4) {
      iVar1 = unlink(filename);
      bVar4 = iVar1 == 0;
      if (bVar4) {
        __errnum = 4;
        break;
      }
      __errnum = *puVar2;
    }
  }
  if (bVar4) {
    return;
  }
  pcVar3 = strerror(__errnum);
  logmsg("Error removing lock file %s error: %d %s",filename,(ulong)__errnum,pcVar3);
  return;
}

Assistant:

void clear_advisor_read_lock(const char *filename)
{
  int error = 0;
  int res;

  /*
  ** Log all removal failures. Even those due to file not existing.
  ** This allows to detect if unexpectedly the file has already been
  ** removed by a process different than the one that should do this.
  */

  do {
    res = unlink(filename);
  } while(res && ((error = ERRNO) == EINTR));
  if(res)
    logmsg("Error removing lock file %s error: %d %s",
           filename, error, strerror(error));
}